

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryAnimationsLoader14.cpp
# Opt level: O2

void __thiscall
COLLADASaxFWL::LibraryAnimationsLoader14::begin__Name_array(LibraryAnimationsLoader14 *this)

{
  Name_array__AttributeData *in_RSI;
  
  begin__Name_array((LibraryAnimationsLoader14 *)&this[-1].super_SourceArrayLoader14.mLoader,in_RSI)
  ;
  return;
}

Assistant:

bool LibraryAnimationsLoader14::begin__Name_array( const COLLADASaxFWL14::Name_array__AttributeData& attributeData )
{
SaxVirtualFunctionTest14(begin__Name_array(attributeData));
COLLADASaxFWL::Name_array__AttributeData attrData;
attrData.present_attributes = 0;
attrData.id = attributeData.id;
attrData.name = attributeData.name;
if ( (attributeData.present_attributes & COLLADASaxFWL14::Name_array__AttributeData::ATTRIBUTE_COUNT_PRESENT) == COLLADASaxFWL14::Name_array__AttributeData::ATTRIBUTE_COUNT_PRESENT ) {
    attrData.count = attributeData.count;
    attrData.present_attributes |= COLLADASaxFWL::Name_array__AttributeData::ATTRIBUTE_COUNT_PRESENT;
}
return mLoader->begin__Name_array(attrData);
}